

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

void __thiscall duckdb::CatalogEntryMap::DropEntry(CatalogEntryMap *this,CatalogEntry *entry)

{
  string *name;
  long *plVar1;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  CatalogEntry *this_00;
  iterator __position;
  InternalException *this_01;
  allocator local_69;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_68;
  _Alloc_hider local_60;
  
  name = &entry->name;
  oVar2 = GetEntry(this,name);
  if (oVar2.ptr == (CatalogEntry *)0x0) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffa0,
               "Attempting to drop entry with name \"%s\" but no chain with that name exists",
               &local_69);
    ::std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)name);
    InternalException::InternalException<std::__cxx11::string>
              (this_01,(string *)&stack0xffffffffffffffa0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffc0);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  CatalogEntry::TakeChild((CatalogEntry *)&stack0xffffffffffffffa0);
  if ((entry->parent).ptr == (CatalogEntry *)0x0) {
    __position = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                         *)this,name);
    plVar1 = *(long **)(__position._M_node + 2);
    *(undefined8 *)(__position._M_node + 2) = 0;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if ((CatalogEntry *)local_60._M_p == (CatalogEntry *)0x0) {
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>,duckdb::CaseInsensitiveStringCompare,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>,duckdb::CaseInsensitiveStringCompare,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>>
                          *)this,__position);
    }
    else {
      plVar1 = *(long **)(__position._M_node + 2);
      *(pointer *)(__position._M_node + 2) = local_60._M_p;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        return;
      }
    }
  }
  else {
    this_00 = optional_ptr<duckdb::CatalogEntry,_true>::operator*(&entry->parent);
    local_68._M_head_impl = (CatalogEntry *)local_60._M_p;
    local_60._M_p = (pointer)0x0;
    CatalogEntry::SetChild
              (this_00,(unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                        *)&local_68);
    if (local_68._M_head_impl != (CatalogEntry *)0x0) {
      (*(local_68._M_head_impl)->_vptr_CatalogEntry[1])();
    }
  }
  return;
}

Assistant:

void CatalogEntryMap::DropEntry(CatalogEntry &entry) {
	auto &name = entry.name;
	auto chain = GetEntry(name);
	if (!chain) {
		throw InternalException("Attempting to drop entry with name \"%s\" but no chain with that name exists", name);
	}
	auto child = entry.TakeChild();
	if (!entry.HasParent()) {
		// This is the top of the chain
		D_ASSERT(chain.get() == &entry);
		auto it = entries.find(name);
		D_ASSERT(it != entries.end());

		// Remove the entry
		it->second.reset();
		if (child) {
			// Replace it with its child
			it->second = std::move(child);
		} else {
			entries.erase(it);
		}
	} else {
		// Just replace the entry with its child
		auto &parent = entry.Parent();
		parent.SetChild(std::move(child));
	}
}